

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_format.cpp
# Opt level: O2

void __thiscall format_references_Test::~format_references_Test(format_references_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(format, references)
{
    EXPECT_EQ(ST_LITERAL("2, one"), ST::format("{&2}, {&1}", "one", 2));
    EXPECT_EQ(ST_LITERAL("2, 2"), ST::format("{&2}, {&2}", "one", 2, 3.5));
    EXPECT_EQ(ST_LITERAL("42|0042|0x2a"), ST::format("{&2}{&1c}{04&2}{&1c}{&2#x}", '|', 42));

    // Mixing ordered and referenced args -- references should not interfere
    // with ordered parameters
    EXPECT_EQ(ST_LITERAL("one, 2, 3.5"), ST::format("{}, {&3}, {}", "one", 3.5, 2));
    EXPECT_EQ(ST_LITERAL("one, 2, 2"), ST::format("{&3}, {&1}, {}", 2, 3.5, "one"));

    // No used actual parameters
    EXPECT_EQ(ST_LITERAL("xxxx"), ST::format("xxxx", "one", 2, 3.5));
    EXPECT_EQ(ST_LITERAL("xxxx"), ST::format("xxxx"));
}